

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
setup_and_assign<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *rhs)

{
  char cVar1;
  int32_t iVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  fpclass_type fVar9;
  pointer pnVar10;
  undefined4 *puVar11;
  undefined4 *puVar12;
  long lVar13;
  pointer pnVar14;
  byte bVar15;
  type t;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar15 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  iVar4 = (rhs->super_IdxSet).len;
  *(int *)(this + 0xc) = iVar4;
  spx_realloc<int*>((int **)(this + 0x10),iVar4);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)(this + 0x20),
          (int)((ulong)((long)(rhs->
                              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(rhs->
                             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 7),true);
  *(element_type **)(this + 0x40) =
       (rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 0x48),
             &(rhs->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  if (rhs->setupStatus == true) {
    IdxSet::operator=((IdxSet *)this,&rhs->super_IdxSet);
    if (0 < (long)*(int *)(this + 8)) {
      uVar5 = (long)*(int *)(this + 8) + 1;
      do {
        lVar7 = (long)(*(int **)(this + 0x10))[uVar5 - 2];
        pnVar14 = (rhs->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar8 = lVar7 * 0x80;
        lVar13 = *(long *)(this + 0x20);
        pnVar10 = pnVar14 + lVar7;
        puVar11 = (undefined4 *)(lVar13 + lVar8);
        for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
          *puVar11 = (pnVar10->m_backend).data._M_elems[0];
          pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar15 * -2 + 1) * 4);
          puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
        }
        *(int *)(lVar13 + 0x70 + lVar8) = pnVar14[lVar7].m_backend.exp;
        *(bool *)(lVar13 + 0x74 + lVar8) = pnVar14[lVar7].m_backend.neg;
        *(undefined8 *)(lVar13 + 0x78 + lVar8) = *(undefined8 *)&pnVar14[lVar7].m_backend.fpclass;
        uVar5 = uVar5 - 1;
      } while (1 < uVar5);
    }
  }
  else {
    pnVar14 = (rhs->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pnVar10 = (rhs->
              super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)(this + 8) = 0;
    uVar3 = (uint)((ulong)((long)pnVar14 - (long)pnVar10) >> 7);
    if ((int)uVar3 < 1) {
      iVar4 = 0;
    }
    else {
      lVar13 = 0;
      uVar5 = 0;
      do {
        pnVar14 = (rhs->
                  super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        fVar9 = cpp_dec_float_NaN;
        if (*(int *)((long)&(pnVar14->m_backend).data + lVar13 + 0x78) == 2) {
LAB_00533b79:
          iVar4 = *(int *)((long)&(pnVar14->m_backend).data + lVar13 + 0x70);
          cVar1 = *(char *)((long)&(pnVar14->m_backend).data + lVar13 + 0x74);
          iVar2 = *(int32_t *)((long)&(pnVar14->m_backend).data + lVar13 + 0x7c);
          memmove(&local_130,(void *)((long)&(pnVar14->m_backend).data + lVar13),0x70);
          local_130.neg = (bool)cVar1;
          if ((cVar1 == '\x01') &&
             (fVar9 != cpp_dec_float_finite || local_130.data._M_elems[0] != 0)) {
            local_130.neg = false;
          }
          local_130.exp = iVar4;
          local_130.fpclass = fVar9;
          local_130.prec_elem = iVar2;
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::getEpsilon((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_b0,
                       (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)this);
          if (((local_130.fpclass == cpp_dec_float_NaN) || (local_b0.fpclass == cpp_dec_float_NaN))
             || (iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                                   (&local_130,&local_b0), iVar4 < 1)) {
            boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                      ((cpp_dec_float<200U,_int,_void> *)
                       ((long)&(((rhs->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_backend).data +
                       lVar13),0);
          }
          else {
            (rhs->super_IdxSet).idx[*(int *)(this + 8)] = (int)uVar5;
            *(int *)(*(long *)(this + 0x10) + (long)*(int *)(this + 8) * 4) = (int)uVar5;
            pnVar14 = (rhs->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar6 = *(long *)(this + 0x20);
            puVar11 = (undefined4 *)((long)&(pnVar14->m_backend).data + lVar13);
            puVar12 = (undefined4 *)(lVar6 + lVar13);
            for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
              *puVar12 = *puVar11;
              puVar11 = puVar11 + (ulong)bVar15 * -2 + 1;
              puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
            }
            *(undefined4 *)(lVar6 + 0x70 + lVar13) =
                 *(undefined4 *)((long)&(pnVar14->m_backend).data + lVar13 + 0x70);
            *(undefined1 *)(lVar6 + 0x74 + lVar13) =
                 *(undefined1 *)((long)&(pnVar14->m_backend).data + lVar13 + 0x74);
            *(undefined8 *)(lVar6 + 0x78 + lVar13) =
                 *(undefined8 *)((long)&(pnVar14->m_backend).data + lVar13 + 0x78);
            *(int *)(this + 8) = *(int *)(this + 8) + 1;
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_130,0,(type *)0x0);
          iVar4 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            ((cpp_dec_float<200U,_int,_void> *)
                             ((long)&(pnVar14->m_backend).data + lVar13),&local_130);
          if (iVar4 != 0) {
            pnVar14 = (rhs->
                      super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            fVar9 = *(fpclass_type *)((long)&(pnVar14->m_backend).data + lVar13 + 0x78);
            goto LAB_00533b79;
          }
        }
        uVar5 = uVar5 + 1;
        lVar13 = lVar13 + 0x80;
      } while ((uVar3 & 0x7fffffff) != uVar5);
      iVar4 = *(int *)(this + 8);
    }
    (rhs->super_IdxSet).num = iVar4;
    rhs->setupStatus = true;
  }
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x1;
  return;
}

Assistant:

void setup_and_assign(SSVectorBase<S>& rhs)
   {
      clear();
      setMax(rhs.max());
      VectorBase<R>::reDim(rhs.dim());
      _tolerances = rhs.tolerances();

      if(rhs.isSetup())
      {
         IdxSet::operator=(rhs);

         for(int i = size() - 1; i >= 0; --i)
         {
            int j  = index(i);
            VectorBase<R>::val[j] = rhs.val[j];
         }
      }
      else
      {
         int d = rhs.dim();
         num = 0;

         for(int i = 0; i < d; ++i)
         {
            if(rhs.val[i] != 0)
            {
               if(spxAbs(rhs.val[i]) > this->getEpsilon())
               {
                  rhs.idx[num] = i;
                  idx[num] = i;
                  VectorBase<R>::val[i] = rhs.val[i];
                  num++;
               }
               else
                  rhs.val[i] = 0;
            }
         }

         rhs.num = num;
         rhs.setupStatus = true;
      }

      setupStatus = true;

      assert(rhs.isConsistent());
      assert(isConsistent());
   }